

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_crusader.cpp
# Opt level: O3

int AF_A_CrusaderSweepLeft(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  double dVar1;
  VM_UBYTE VVar2;
  undefined8 *puVar3;
  PClass *pPVar4;
  int iVar5;
  undefined4 extraout_var;
  PClass *pPVar6;
  PClassActor *type;
  AActor *pAVar7;
  uint uVar8;
  VMValue *pVVar9;
  char *__assertion;
  AActor *dest;
  bool bVar10;
  bool bVar11;
  
  pPVar4 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005f36f8;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    pAVar7 = (AActor *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (pAVar7 == (AActor *)0x0) {
LAB_005f3590:
        pAVar7 = (AActor *)0x0;
        pVVar9 = param;
        uVar8 = numparam;
      }
      else {
        pPVar6 = (pAVar7->super_DThinker).super_DObject.Class;
        if (pPVar6 == (PClass *)0x0) {
          iVar5 = (**(pAVar7->super_DThinker).super_DObject._vptr_DObject)(pAVar7);
          pPVar6 = (PClass *)CONCAT44(extraout_var,iVar5);
          (pAVar7->super_DThinker).super_DObject.Class = pPVar6;
        }
        bVar10 = pPVar6 == (PClass *)0x0;
        ret = (VMReturn *)(ulong)!bVar10;
        bVar11 = pPVar6 == pPVar4;
        if (!bVar11 && !bVar10) {
          do {
            pPVar6 = pPVar6->ParentClass;
            ret = (VMReturn *)(ulong)(pPVar6 != (PClass *)0x0);
            if (pPVar6 == pPVar4) break;
          } while (pPVar6 != (PClass *)0x0);
        }
        pVVar9 = (VMValue *)(ulong)(bVar11 || bVar10);
        uVar8 = (uint)bVar10;
        if ((char)ret == '\0') {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005f36f8;
        }
      }
      pPVar4 = AActor::RegistrationInfo.MyClass;
      if (numparam != 1) {
        VVar2 = param[1].field_0.field_3.Type;
        if (VVar2 != 0xff) {
          if (VVar2 != '\x03') goto LAB_005f36e8;
          puVar3 = (undefined8 *)param[1].field_0.field_1.a;
          if (param[1].field_0.field_1.atag == 1) {
            if (puVar3 != (undefined8 *)0x0) {
              pPVar6 = (PClass *)puVar3[1];
              if (pPVar6 == (PClass *)0x0) {
                pPVar6 = (PClass *)(**(code **)*puVar3)(puVar3,pVVar9,uVar8,ret);
                puVar3[1] = pPVar6;
              }
              bVar10 = pPVar6 != (PClass *)0x0;
              if (pPVar6 != pPVar4 && bVar10) {
                do {
                  pPVar6 = pPVar6->ParentClass;
                  bVar10 = pPVar6 != (PClass *)0x0;
                  if (pPVar6 == pPVar4) break;
                } while (pPVar6 != (PClass *)0x0);
              }
              if (!bVar10) {
                __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
                goto LAB_005f36f8;
              }
            }
          }
          else if (puVar3 != (undefined8 *)0x0) goto LAB_005f36e8;
        }
        if (((2 < numparam) && (VVar2 = param[2].field_0.field_3.Type, VVar2 != 0xff)) &&
           ((VVar2 != '\x03' ||
            ((param[2].field_0.field_1.atag != 8 && (param[2].field_0.field_1.a != (void *)0x0))))))
        {
          __assertion = 
          "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
          ;
          goto LAB_005f36f8;
        }
      }
      dVar1 = (pAVar7->__Pos).Z;
      (pAVar7->Angles).Yaw.Degrees = (pAVar7->Angles).Yaw.Degrees + 5.625;
      dest = (pAVar7->target).field_0.p;
      if (dest != (AActor *)0x0) {
        if (((dest->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) goto LAB_005f369c;
        (pAVar7->target).field_0.p = (AActor *)0x0;
      }
      dest = (AActor *)0x0;
LAB_005f369c:
      type = PClass::FindActor("FastFlameMissile");
      pAVar7 = P_SpawnMissileZAimed(pAVar7,dVar1 + 48.0,dest,type);
      if (pAVar7 != (AActor *)0x0) {
        (pAVar7->Vel).Z = (pAVar7->Vel).Z + 1.0;
      }
      return 0;
    }
    if (pAVar7 == (AActor *)0x0) goto LAB_005f3590;
  }
LAB_005f36e8:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_005f36f8:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_crusader.cpp"
                ,0x36,"int AF_A_CrusaderSweepLeft(VMFrameStack *, VMValue *, int, VMReturn *, int)")
  ;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_CrusaderSweepLeft)
{
	PARAM_ACTION_PROLOGUE;

	self->Angles.Yaw += 90./16;
	AActor *misl = P_SpawnMissileZAimed (self, self->Z() + 48, self->target, PClass::FindActor("FastFlameMissile"));
	if (misl != NULL)
	{
		misl->Vel.Z += 1;
	}
	return 0;
}